

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiRowCount(Fts5Context *pCtx,i64 *pnRow)

{
  int iVar1;
  Fts5FullTable *pTab;
  Fts5Cursor *pCsr;
  i64 *pnRow_local;
  Fts5Context *pCtx_local;
  
  iVar1 = sqlite3Fts5StorageRowCount(*(Fts5Storage **)(*(long *)pCtx + 0x28),pnRow);
  return iVar1;
}

Assistant:

static int fts5ApiRowCount(Fts5Context *pCtx, i64 *pnRow){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
  return sqlite3Fts5StorageRowCount(pTab->pStorage, pnRow);
}